

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QCalendarPopup::setCalendarWidget(QCalendarPopup *this,QCalendarWidget *cw)

{
  QCalendarWidget *pQVar1;
  char *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  QVBoxLayout *widgetLayout;
  QWidget *in_stack_ffffffffffffff38;
  QMargins *in_stack_ffffffffffffff40;
  QBoxLayout *this_00;
  QMargins *in_stack_ffffffffffffff48;
  QLayout *in_stack_ffffffffffffff50;
  undefined8 local_60;
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [12];
  undefined4 local_2c;
  QBoxLayout local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::layout((QWidget *)0x562075);
  local_60 = qobject_cast<QVBoxLayout*>((QObject *)0x56207d);
  if (local_60 == (QVBoxLayout *)0x0) {
    local_60 = (QVBoxLayout *)operator_new(0x20);
    QVBoxLayout::QVBoxLayout((QVBoxLayout *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    QMargins::QMargins(in_stack_ffffffffffffff40);
    QLayout::setContentsMargins(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    (**(code **)(*(long *)&(local_60->super_QBoxLayout).super_QLayout + 0x68))(local_60,0);
  }
  pQVar1 = QPointer<QCalendarWidget>::data((QPointer<QCalendarWidget> *)0x5620f4);
  if (pQVar1 != (QCalendarWidget *)0x0) {
    (**(code **)(*(long *)&pQVar1->super_QWidget + 0x20))();
  }
  this_00 = &local_28;
  QPointer<QCalendarWidget>::QPointer<void>
            ((QPointer<QCalendarWidget> *)this_00,(QCalendarWidget *)in_stack_ffffffffffffff38);
  QPointer<QCalendarWidget>::operator=
            ((QPointer<QCalendarWidget> *)this_00,
             (QPointer<QCalendarWidget> *)in_stack_ffffffffffffff38);
  QPointer<QCalendarWidget>::~QPointer((QPointer<QCalendarWidget> *)0x56213e);
  local_2c = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x56216a);
  QBoxLayout::addWidget(this_00,in_stack_ffffffffffffff38,0,(Alignment)local_60._4_4_);
  QObject::connect(local_38,in_RSI,(QObject *)"2activated(QDate)",in_RDI,0xb16de5);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  QObject::connect(local_40,in_RSI,(QObject *)"2clicked(QDate)",in_RDI,0xb16de5);
  QMetaObject::Connection::~Connection((Connection *)local_40);
  QObject::connect(local_48,in_RSI,(QObject *)"2selectionChanged()",in_RDI,0xb16e0e);
  QMetaObject::Connection::~Connection((Connection *)local_48);
  QWidget::setFocus((QWidget *)0x56223e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarPopup::setCalendarWidget(QCalendarWidget *cw)
{
    Q_ASSERT(cw);
    QVBoxLayout *widgetLayout = qobject_cast<QVBoxLayout*>(layout());
    if (!widgetLayout) {
        widgetLayout = new QVBoxLayout(this);
        widgetLayout->setContentsMargins(QMargins());
        widgetLayout->setSpacing(0);
    }
    delete calendar.data();
    calendar = QPointer<QCalendarWidget>(cw);
    widgetLayout->addWidget(cw);

    connect(cw, SIGNAL(activated(QDate)), this, SLOT(dateSelected(QDate)));
    connect(cw, SIGNAL(clicked(QDate)), this, SLOT(dateSelected(QDate)));
    connect(cw, SIGNAL(selectionChanged()), this, SLOT(dateSelectionChanged()));

    cw->setFocus();
}